

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

base_learner * print_setup(options_i *options,vw *all)

{
  typed_option<bool> *dat;
  pointer ppVar1;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<print,_example> *ret;
  free_ptr<print> p;
  option_group_definition new_options;
  bool print_option;
  typed_option<bool> *in_stack_fffffffffffffd88;
  typed_option<bool> *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  typed_option<bool> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  typed_option<bool> local_1d0 [2];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Print psuedolearner",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90,
             (string *)in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"print",&local_1f1);
  VW::config::make_option<bool>(in_stack_fffffffffffffd98,(bool *)in_stack_fffffffffffffd90);
  VW::config::typed_option<bool>::keep(local_1d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"print examples",(allocator *)&stack0xfffffffffffffde7);
  dat = VW::config::typed_option<bool>::help
                  (in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
  VW::config::typed_option<bool>::typed_option(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_10)(local_10,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    scoped_calloc_or_throw<print>();
    ppVar1 = std::unique_ptr<print,_void_(*)(void_*)>::operator->
                       ((unique_ptr<print,_void_(*)(void_*)> *)0x2bc46d);
    ppVar1->all = local_18;
    parameters::stride_shift
              ((parameters *)in_stack_fffffffffffffd90,
               (uint32_t)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    in_stack_fffffffffffffd90 =
         (typed_option<bool> *)
         LEARNER::init_learner<print,example,LEARNER::learner<char,char>>
                   ((free_ptr<print> *)dat,
                    (_func_void_print_ptr_learner<char,_char>_ptr_example_ptr *)local_18,
                    (_func_void_print_ptr_learner<char,_char>_ptr_example_ptr *)
                    in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    local_8 = LEARNER::make_base<print,example>
                        ((learner<print,_example> *)in_stack_fffffffffffffd90);
    std::unique_ptr<print,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<print,_void_(*)(void_*)> *)dat);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90);
  return local_8;
}

Assistant:

LEARNER::base_learner* print_setup(options_i& options, vw& all)
{
  bool print_option = false;
  option_group_definition new_options("Print psuedolearner");
  new_options.add(make_option("print", print_option).keep().help("print examples"));
  options.add_and_parse(new_options);

  if (!print_option)
    return nullptr;

  auto p = scoped_calloc_or_throw<print>();
  p->all = &all;

  all.weights.stride_shift(0);

  LEARNER::learner<print, example>& ret = init_learner(p, learn, learn, 1);
  return make_base(ret);
}